

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf16_regexp.cc
# Opt level: O2

RegExp * re2c::UTF16Symbol(rune r)

{
  CatOp *this;
  MatchOp *this_00;
  Range *pRVar1;
  MatchOp *this_01;
  
  if (r < 0x10000) {
    this = (CatOp *)operator_new(0x10);
    pRVar1 = Range::sym(r);
    MatchOp::MatchOp((MatchOp *)this,pRVar1);
  }
  else {
    this = (CatOp *)operator_new(0x18);
    this_00 = (MatchOp *)operator_new(0x10);
    pRVar1 = Range::sym((r - 0x10000 >> 10) + 0xd800);
    MatchOp::MatchOp(this_00,pRVar1);
    this_01 = (MatchOp *)operator_new(0x10);
    pRVar1 = Range::sym((r & 0x3ff) + 0xdc00);
    MatchOp::MatchOp(this_01,pRVar1);
    CatOp::CatOp(this,(RegExp *)this_00,(RegExp *)this_01);
  }
  return &this->super_RegExp;
}

Assistant:

RegExp * UTF16Symbol(utf16::rune r)
{
	if (r <= utf16::MAX_1WORD_RUNE)
		return new MatchOp(Range::sym (r));
	else
	{
		const uint32_t ld = utf16::lead_surr(r);
		const uint32_t tr = utf16::trail_surr(r);
		return new CatOp(new MatchOp(Range::sym (ld)), new MatchOp(Range::sym (tr)));
	}
}